

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::MultipleOneOf(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                *this,SizeType index1,SizeType index2)

{
  CrtAllocator *pCVar1;
  StringRefType *pSVar2;
  ValueType matches;
  StringRefType local_28;
  
  matches.data_.n = (Number)0x0;
  matches.data_.s.str = (Ch *)0x4000000000000;
  pCVar1 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack<unsigned_int>
            (&matches,index1,pCVar1);
  pCVar1 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack<unsigned_int>
            (&matches,index2,pCVar1);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetObject(&this->currentError_);
  pSVar2 = GetMatchesString();
  local_28.s = pSVar2->s;
  local_28.length = pSVar2->length;
  pCVar1 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (&this->currentError_,&local_28,&matches,pCVar1);
  AddCurrentError(this,kValidateErrorOneOfMatch,false);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&matches);
  return;
}

Assistant:

void MultipleOneOf(SizeType index1, SizeType index2) {
        ValueType matches(kArrayType);
        matches.PushBack(index1, GetStateAllocator());
        matches.PushBack(index2, GetStateAllocator());
        currentError_.SetObject();
        currentError_.AddMember(GetMatchesString(), matches, GetStateAllocator());
        AddCurrentError(kValidateErrorOneOfMatch);
    }